

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void ConvertToYUVA(uint32_t *src,int width,int y_pos,WebPDecBuffer *output)

{
  long in_RCX;
  uint in_EDX;
  int in_ESI;
  uint32_t *in_RDI;
  uint8_t *a;
  uint8_t *v;
  uint8_t *u;
  WebPYUVABuffer *buf;
  
  (*WebPConvertARGBToY)
            (in_RDI,(uint8_t *)
                    (*(long *)(in_RCX + 0x10) + (long)(int)(in_EDX * *(int *)(in_RCX + 0x30))),
             in_ESI);
  (*WebPConvertARGBToUV)
            (in_RDI,(uint8_t *)
                    (*(long *)(in_RCX + 0x18) + (long)(((int)in_EDX >> 1) * *(int *)(in_RCX + 0x34))
                    ),(uint8_t *)
                      (*(long *)(in_RCX + 0x20) +
                      (long)(((int)in_EDX >> 1) * *(int *)(in_RCX + 0x38))),in_ESI,
             (uint)(((in_EDX & 1) != 0 ^ 0xffU) & 1));
  if (*(long *)(in_RCX + 0x28) != 0) {
    (*WebPExtractAlpha)((uint8_t *)((long)in_RDI + 3),0,in_ESI,1,
                        (uint8_t *)
                        (*(long *)(in_RCX + 0x28) + (long)(int)(in_EDX * *(int *)(in_RCX + 0x3c))),0
                       );
  }
  return;
}

Assistant:

static void ConvertToYUVA(const uint32_t* const src, int width, int y_pos,
                          const WebPDecBuffer* const output) {
  const WebPYUVABuffer* const buf = &output->u.YUVA;

  // first, the luma plane
  WebPConvertARGBToY(src, buf->y + y_pos * buf->y_stride, width);

  // then U/V planes
  {
    uint8_t* const u = buf->u + (y_pos >> 1) * buf->u_stride;
    uint8_t* const v = buf->v + (y_pos >> 1) * buf->v_stride;
    // even lines: store values
    // odd lines: average with previous values
    WebPConvertARGBToUV(src, u, v, width, !(y_pos & 1));
  }
  // Lastly, store alpha if needed.
  if (buf->a != NULL) {
    uint8_t* const a = buf->a + y_pos * buf->a_stride;
#if defined(WORDS_BIGENDIAN)
    WebPExtractAlpha((uint8_t*)src + 0, 0, width, 1, a, 0);
#else
    WebPExtractAlpha((uint8_t*)src + 3, 0, width, 1, a, 0);
#endif
  }
}